

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O1

GenlibClientSubscription * GenlibClientSubscription_new(void)

{
  GenlibClientSubscription *pGVar1;
  UpnpString *pUVar2;
  
  pGVar1 = (GenlibClientSubscription *)calloc(1,0x28);
  if (pGVar1 == (GenlibClientSubscription *)0x0) {
    pGVar1 = (GenlibClientSubscription *)0x0;
  }
  else {
    pUVar2 = UpnpString_new();
    pGVar1->m_SID = pUVar2;
    pUVar2 = UpnpString_new();
    pGVar1->m_ActualSID = pUVar2;
    pUVar2 = UpnpString_new();
    pGVar1->m_EventURL = pUVar2;
  }
  return pGVar1;
}

Assistant:

GenlibClientSubscription *GenlibClientSubscription_new(void)
{
	struct s_GenlibClientSubscription *p =
		calloc(1, sizeof(struct s_GenlibClientSubscription));

	if (!p)
		return 0;

	/*p->m_RenewEventId = 0;*/
	p->m_SID = UpnpString_new();
	p->m_ActualSID = UpnpString_new();
	p->m_EventURL = UpnpString_new();
	/*p->m_Next = 0;*/

	return (GenlibClientSubscription *)p;
}